

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvlist.c
# Opt level: O2

nvlist_t * nvlist_get_parent(nvlist_t *nvl,void **cookiep)

{
  nvpair_t *nvp;
  nvlist_t *pnVar1;
  char *__assertion;
  
  if (nvl == (nvlist_t *)0x0) {
    __assertion = "(nvl) != ((void*)0)";
  }
  else {
    if (nvl->nvl_magic == 0x6e766c) {
      nvp = nvl->nvl_parent;
      if (cookiep != (void **)0x0) {
        *cookiep = nvp;
      }
      if (nvp != (nvpair_t *)0x0) {
        pnVar1 = nvpair_nvlist(nvp);
        return pnVar1;
      }
      return (nvlist_t *)0x0;
    }
    __assertion = "(nvl)->nvl_magic == 0x6e766c";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvlist.c"
                ,0xc5,"const nvlist_t *nvlist_get_parent(const nvlist_t *, void **)");
}

Assistant:

const nvlist_t *
nvlist_get_parent(const nvlist_t *nvl, void **cookiep)
{
	nvpair_t *nvp;

	NVLIST_ASSERT(nvl);

	nvp = nvl->nvl_parent;
	if (cookiep != NULL)
		*cookiep = nvp;
	if (nvp == NULL)
		return (NULL);

	return (nvpair_nvlist(nvp));
}